

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JtagAnalyzer.cpp
# Opt level: O2

void __thiscall
JtagAnalyzer::CloseFrameV2
          (JtagAnalyzer *this,Frame *frm,JtagShiftedData *shifted_data,U64 ending_sample_number)

{
  char *pcVar1;
  FrameV2 frame_v2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  JtagShiftedData corrected_shifted_data;
  FrameV2 local_70 [8];
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  JtagShiftedData local_50;
  
  local_50.mTdoBits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50.mTdoBits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50.mTdiBits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50.mTdoBits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_50.mTdiBits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_50.mTdiBits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  CloseFrame(this,frm,shifted_data,ending_sample_number,&local_50);
  FrameV2::FrameV2(local_70);
  if (local_50.mTdiBits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_50.mTdiBits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    BitsToBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68,
                &local_50.mTdiBits);
    FrameV2::AddByteArray
              ((char *)local_70,(uchar *)"TDI",
               (ulonglong)local_68._M_impl.super__Vector_impl_data._M_start);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_68);
  }
  if (local_50.mTdoBits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_50.mTdoBits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    BitsToBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68,
                &local_50.mTdoBits);
    FrameV2::AddByteArray
              ((char *)local_70,"TDO",(ulonglong)local_68._M_impl.super__Vector_impl_data._M_start);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_68);
  }
  FrameV2::AddInteger((char *)local_70,0x10d179);
  pcVar1 = JtagAnalyzerResults::GetStateDescShort((this->mTAPCtrl).mCurrTAPState);
  AnalyzerResults::AddFrameV2
            ((FrameV2 *)(this->mResults)._M_ptr,(char *)local_70,(ulonglong)pcVar1,*(ulonglong *)frm
            );
  FrameV2::~FrameV2(local_70);
  JtagShiftedData::~JtagShiftedData(&local_50);
  return;
}

Assistant:

void JtagAnalyzer::CloseFrameV2( Frame& frm, JtagShiftedData& shifted_data, U64 ending_sample_number )
{
    JtagShiftedData corrected_shifted_data;

    CloseFrame( frm, shifted_data, ending_sample_number, &corrected_shifted_data );

    FrameV2 frame_v2;

    size_t max_bit_count = 0;

    if( corrected_shifted_data.mTdiBits.size() > 0 )
    {
        std::vector<U8> data = BitsToBytes( corrected_shifted_data.mTdiBits );

        frame_v2.AddByteArray( "TDI", &data[ 0 ], data.size() );

        if( max_bit_count < corrected_shifted_data.mTdiBits.size() )
        {
            max_bit_count = corrected_shifted_data.mTdiBits.size();
        }
    }

    if( corrected_shifted_data.mTdoBits.size() > 0 )
    {
        std::vector<U8> data = BitsToBytes( corrected_shifted_data.mTdoBits );

        frame_v2.AddByteArray( "TDO", &data[ 0 ], data.size() );

        if( max_bit_count < corrected_shifted_data.mTdoBits.size() )
        {
            max_bit_count = corrected_shifted_data.mTdoBits.size();
        }
    }

    frame_v2.AddInteger( "BitCount", max_bit_count );

    const char* type = JtagAnalyzerResults::GetStateDescShort( mTAPCtrl.GetCurrState() );

    mResults->AddFrameV2( frame_v2, type, frm.mStartingSampleInclusive, frm.mEndingSampleInclusive );
}